

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.hpp
# Opt level: O0

char * __thiscall boost::filesystem::filesystem_error::what(filesystem_error *this)

{
  bool bVar1;
  element_type *peVar2;
  ulong uVar3;
  char *pcVar4;
  type pmVar5;
  string *psVar6;
  filesystem_error *this_local;
  
  peVar2 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::get(&this->m_imp_ptr);
  if (peVar2 == (element_type *)0x0) {
    this_local = (filesystem_error *)system::system_error::what(&this->super_system_error);
  }
  else {
    shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(&this->m_imp_ptr);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      pcVar4 = system::system_error::what(&this->super_system_error);
      pmVar5 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(&this->m_imp_ptr);
      std::__cxx11::string::operator=((string *)&pmVar5->m_what,pcVar4);
      pmVar5 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(&this->m_imp_ptr);
      bVar1 = filesystem::path::empty(&pmVar5->m_path1);
      if (!bVar1) {
        pmVar5 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->
                           (&this->m_imp_ptr);
        std::__cxx11::string::operator+=((string *)&pmVar5->m_what,": \"");
        pmVar5 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->
                           (&this->m_imp_ptr);
        psVar6 = filesystem::path::string_abi_cxx11_(&pmVar5->m_path1);
        pmVar5 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->
                           (&this->m_imp_ptr);
        std::__cxx11::string::operator+=((string *)&pmVar5->m_what,(string *)psVar6);
        pmVar5 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->
                           (&this->m_imp_ptr);
        std::__cxx11::string::operator+=((string *)&pmVar5->m_what,"\"");
      }
      pmVar5 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(&this->m_imp_ptr);
      bVar1 = filesystem::path::empty(&pmVar5->m_path2);
      if (!bVar1) {
        pmVar5 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->
                           (&this->m_imp_ptr);
        std::__cxx11::string::operator+=((string *)&pmVar5->m_what,", \"");
        pmVar5 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->
                           (&this->m_imp_ptr);
        psVar6 = filesystem::path::string_abi_cxx11_(&pmVar5->m_path2);
        pmVar5 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->
                           (&this->m_imp_ptr);
        std::__cxx11::string::operator+=((string *)&pmVar5->m_what,(string *)psVar6);
        pmVar5 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->
                           (&this->m_imp_ptr);
        std::__cxx11::string::operator+=((string *)&pmVar5->m_what,"\"");
      }
    }
    shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(&this->m_imp_ptr);
    this_local = (filesystem_error *)std::__cxx11::string::c_str();
  }
  return (char *)this_local;
}

Assistant:

const char* what() const BOOST_NOEXCEPT_OR_NOTHROW
      {
        if (!m_imp_ptr.get())
        return system::system_error::what();

        try
        {
          if (m_imp_ptr->m_what.empty())
          {
            m_imp_ptr->m_what = system::system_error::what();
            if (!m_imp_ptr->m_path1.empty())
            {
              m_imp_ptr->m_what += ": \"";
              m_imp_ptr->m_what += m_imp_ptr->m_path1.string();
              m_imp_ptr->m_what += "\"";
            }
            if (!m_imp_ptr->m_path2.empty())
            {
              m_imp_ptr->m_what += ", \"";
              m_imp_ptr->m_what += m_imp_ptr->m_path2.string();
              m_imp_ptr->m_what += "\"";
            }
          }
          return m_imp_ptr->m_what.c_str();
        }
        catch (...)
        {
          return system::system_error::what();
        }
      }